

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_iterator.hpp
# Opt level: O3

void __thiscall
burst::
merge_iterator<__gnu_cxx::__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>,_std::less<void>_>
::increment(merge_iterator<__gnu_cxx::__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>,_std::less<void>_>
            *this)

{
  __normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>
  _Var1;
  iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
  __value;
  int iVar2;
  integer_range<int> *piVar3;
  _Iter_comp_val<burst::compose_fn<burst::apply_fn<burst::invert_t<std::less<void>_>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>_>
  __cmp;
  _Iter_comp_iter<burst::compose_fn<burst::apply_fn<burst::invert_t<std::less<void>_>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>_>
  in_stack_ffffffffffffffe8;
  _Iter_comp_val<burst::compose_fn<burst::apply_fn<burst::invert_t<std::less<void>_>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>_>
  local_b;
  
  _Var1._M_current = (this->m_begin)._M_current;
  piVar3 = (this->m_end)._M_current;
  if (8 < (long)piVar3 - (long)_Var1._M_current) {
    __value = piVar3[-1].super_iterator_range<boost::range_detail::integer_iterator<int>_>.
              super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
              .
              super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
              .
              super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
    ;
    piVar3[-1].super_iterator_range<boost::range_detail::integer_iterator<int>_>.
    super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
    .
    super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
    .
    super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
         = ((_Var1._M_current)->super_iterator_range<boost::range_detail::integer_iterator<int>_>).
           super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
           .
           super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
           .
           super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
    ;
    std::
    __adjust_heap<__gnu_cxx::__normal_iterator<boost::integer_range<int>*,std::vector<boost::integer_range<int>,std::allocator<boost::integer_range<int>>>>,long,boost::integer_range<int>,__gnu_cxx::__ops::_Iter_comp_iter<burst::compose_fn<burst::apply_fn<burst::invert_t<std::less<void>>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>>
              (_Var1,0,(long)piVar3 + (-8 - (long)_Var1._M_current) >> 3,(integer_range<int>)__value
               ,in_stack_ffffffffffffffe8);
    piVar3 = (this->m_end)._M_current;
  }
  iVar2 = piVar3[-1].super_iterator_range<boost::range_detail::integer_iterator<int>_>.
          super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
          .
          super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
          .
          super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          .m_Begin.m_value + 1;
  piVar3[-1].super_iterator_range<boost::range_detail::integer_iterator<int>_>.
  super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin.m_value = iVar2;
  if (iVar2 == piVar3[-1].super_iterator_range<boost::range_detail::integer_iterator<int>_>.
               super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
               .
               super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
               .m_End.m_value) {
    (this->m_end)._M_current = piVar3 + -1;
  }
  else {
    _Var1._M_current = (this->m_begin)._M_current;
    std::
    __push_heap<__gnu_cxx::__normal_iterator<boost::integer_range<int>*,std::vector<boost::integer_range<int>,std::allocator<boost::integer_range<int>>>>,long,boost::integer_range<int>,__gnu_cxx::__ops::_Iter_comp_val<burst::compose_fn<burst::apply_fn<burst::invert_t<std::less<void>>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>>
              (_Var1,((long)piVar3 - (long)_Var1._M_current >> 3) + -1,0,
               (integer_range<int>)
               piVar3[-1].super_iterator_range<boost::range_detail::integer_iterator<int>_>.
               super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
               .
               super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
               ,&local_b);
  }
  return;
}

Assistant:

void increment ()
        {
            std::pop_heap(m_begin, m_end, each(front) | invert(m_compare));
            auto & range = *std::prev(m_end);

            range.advance_begin(1);
            if (not range.empty())
            {
                std::push_heap(m_begin, m_end, each(front) | invert(m_compare));
            }
            else
            {
                --m_end;
            }
        }